

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  Value *this_00;
  Value local_140;
  allocator<char> local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_b9;
  string local_b8 [8];
  string buffer_1;
  Char buffer [33];
  char format [4];
  allocator<char> local_59;
  string local_58;
  int local_34;
  int local_30;
  int length;
  int count;
  int bufferSize;
  double value;
  Token *token_local;
  Reader *this_local;
  
  _count = 0.0;
  length = 0x20;
  local_34 = (int)token->end_ - (int)token->start_;
  value = (double)token;
  token_local = (Token *)this;
  if (local_34 < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Unable to parse token length",&local_59);
    this_local._7_1_ = addError(this,&local_58,(Token *)value,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  else {
    stack0xffffffffffffff90 = 0x666c25;
    if (local_34 < 0x21) {
      memcpy((void *)((long)&buffer_1.field_2 + 8),token->start_,(long)local_34);
      buffer[(long)local_34 + -8] = '\0';
      local_30 = __isoc99_sscanf((undefined1 *)((long)&buffer_1.field_2 + 8),buffer + 0x20,&count);
    }
    else {
      pcVar1 = token->start_;
      pcVar2 = token->end_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>(local_b8,pcVar1,pcVar2,&local_b9);
      std::allocator<char>::~allocator(&local_b9);
      uVar3 = std::__cxx11::string::c_str();
      local_30 = __isoc99_sscanf(uVar3,buffer + 0x20,&count);
      std::__cxx11::string::~string(local_b8);
    }
    if (local_30 == 1) {
      Value::Value(&local_140,_count);
      this_00 = currentValue(this);
      Value::operator=(this_00,&local_140);
      Value::~Value(&local_140);
      this_local._7_1_ = 1;
    }
    else {
      pcVar1 = *(char **)((long)value + 8);
      pcVar2 = *(char **)((long)value + 0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>((string *)&local_120,pcVar1,pcVar2,&local_121);
      std::operator+(&local_100,"\'",&local_120);
      std::operator+(&local_e0,&local_100,"\' is not a number.");
      this_local._7_1_ = addError(this,&local_e0,(Token *)value,(Location)0x0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator(&local_121);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool 
Reader::decodeDouble( Token &token )
{
   double value = 0;
   const int bufferSize = 32;
   int count;
   int length = int(token.end_ - token.start_);

   // Sanity check to avoid buffer overflow exploits.
   if (length < 0) {
      return addError( "Unable to parse token length", token );
   }

   // Avoid using a string constant for the format control string given to
   // sscanf, as this can cause hard to debug crashes on OS X. See here for more
   // info:
   //
   //     http://developer.apple.com/library/mac/#DOCUMENTATION/DeveloperTools/gcc-4.0.1/gcc/Incompatibilities.html
   char format[] = "%lf";

   if ( length <= bufferSize )
   {
      Char buffer[bufferSize+1];
      memcpy( buffer, token.start_, length );
      buffer[length] = 0;
      count = sscanf( buffer, format, &value );
   }
   else
   {
      std::string buffer( token.start_, token.end_ );
      count = sscanf( buffer.c_str(), format, &value );
   }

   if ( count != 1 )
      return addError( "'" + std::string( token.start_, token.end_ ) + "' is not a number.", token );
   currentValue() = value;
   return true;
}